

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.c
# Opt level: O3

bool check_playing(DESCRIPTOR_DATA *d,char *name)

{
  DESCRIPTOR_DATA **ppDVar1;
  bool bVar2;
  CHAR_DATA *pCVar3;
  DESCRIPTOR_DATA *pDVar4;
  
  pDVar4 = descriptor_list;
  if (descriptor_list != (DESCRIPTOR_DATA *)0x0) {
    do {
      if (((pDVar4 != d) && (pDVar4->character != (CHAR_DATA *)0x0)) &&
         (1 < (ushort)(pDVar4->connected - 1U))) {
        pCVar3 = pDVar4->character;
        if (pDVar4->original != (CHAR_DATA *)0x0) {
          pCVar3 = pDVar4->original;
        }
        bVar2 = str_cmp(name,pCVar3->true_name);
        if (!bVar2) {
          write_to_buffer(d,"That character is already playing.\n\r",0);
          write_to_buffer(d,"Do you wish to connect anyway (Y/N)?",0);
          d->connected = 0x11;
          return true;
        }
      }
      ppDVar1 = &pDVar4->next;
      pDVar4 = *ppDVar1;
    } while (*ppDVar1 != (DESCRIPTOR_DATA *)0x0);
  }
  return false;
}

Assistant:

bool check_playing(DESCRIPTOR_DATA *d, char *name)
{
	DESCRIPTOR_DATA *dold;

	for (dold = descriptor_list; dold; dold = dold->next)
	{
		if (dold != d
			&& dold->character != nullptr
			&& dold->connected != CON_GET_NAME
			&& dold->connected != CON_GET_OLD_PASSWORD
			&& !str_cmp(name, dold->original ? dold->original->true_name : dold->character->true_name))
		{
			write_to_buffer(d, "That character is already playing.\n\r", 0);
			write_to_buffer(d, "Do you wish to connect anyway (Y/N)?", 0);

			d->connected = CON_BREAK_CONNECT;
			return true;
		}
	}

	return false;
}